

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionFunctions.cpp
# Opt level: O0

ExpressionValue *
expFuncFrac(ExpressionValue *__return_storage_ptr__,Identifier *funcName,
           vector<ExpressionValue,_std::allocator<ExpressionValue>_> *parameters)

{
  const_reference pvVar1;
  double dVar2;
  double local_30;
  double intPart;
  vector<ExpressionValue,_std::allocator<ExpressionValue>_> *local_20;
  vector<ExpressionValue,_std::allocator<ExpressionValue>_> *parameters_local;
  Identifier *funcName_local;
  ExpressionValue *result;
  
  intPart._7_1_ = 0;
  local_20 = parameters;
  parameters_local = (vector<ExpressionValue,_std::allocator<ExpressionValue>_> *)funcName;
  funcName_local = (Identifier *)__return_storage_ptr__;
  ExpressionValue::ExpressionValue(__return_storage_ptr__);
  pvVar1 = std::vector<ExpressionValue,_std::allocator<ExpressionValue>_>::operator[](local_20,0);
  if (pvVar1->type == Float) {
    pvVar1 = std::vector<ExpressionValue,_std::allocator<ExpressionValue>_>::operator[](local_20,0);
    dVar2 = modf((pvVar1->field_1).floatValue,&local_30);
    (__return_storage_ptr__->field_1).floatValue = dVar2;
    __return_storage_ptr__->type = Float;
  }
  return __return_storage_ptr__;
}

Assistant:

ExpressionValue expFuncFrac(const Identifier &funcName, const std::vector<ExpressionValue>& parameters)
{
	ExpressionValue result;
	double intPart;

	switch (parameters[0].type)
	{
	case ExpressionValueType::Float:
		result.floatValue = modf(parameters[0].floatValue,&intPart);
		break;
	default:
		return result;
	}

	result.type = ExpressionValueType::Float;
	return result;
}